

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::tickEmotionalState
          (HierarchicalTaskNetworkComponent *this,float dt)

{
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  *this_00;
  map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
  *this_01;
  bool bVar1;
  mapped_type_conflict *pmVar2;
  mapped_type_conflict *pmVar3;
  mapped_type *this_02;
  mapped_type *this_03;
  float fVar4;
  key_type local_40;
  float local_3c;
  HierarchicalTaskNetworkComponent *local_38;
  
  this_00 = &(this->state).current.values;
  local_40 = Alertness;
  local_3c = dt;
  pmVar2 = std::
           map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
           ::operator[](this_00,&local_40);
  fVar4 = Math::clamp(*pmVar2 + -0.09,0.0,100.0);
  *pmVar2 = fVar4;
  local_40 = Boredom;
  pmVar3 = std::
           map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
           ::operator[](this_00,&local_40);
  fVar4 = Math::clamp(*pmVar3 + 0.01,0.0,100.0);
  *pmVar3 = fVar4;
  this_01 = &(this->state).valueTrackers;
  local_40 = Alertness;
  local_38 = this;
  this_02 = std::
            map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
            ::operator[](this_01,&local_40);
  local_40 = Curiosity;
  this_03 = std::
            map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
            ::operator[](this_01,&local_40);
  ValueOverTimeTracker::update(this_02,*pmVar2,local_3c);
  local_40 = Curiosity;
  pmVar2 = std::
           map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
           ::operator[](this_00,&local_40);
  ValueOverTimeTracker::update(this_03,*pmVar2,local_3c);
  bVar1 = std::function<bool_(ValueOverTimeTracker_&)>::operator()
                    (&this_02->durationExceedsExtension,this_02);
  if (bVar1) {
    bVar1 = std::function<bool_(ValueOverTimeTracker_&)>::operator()
                      (&this_03->durationExceedsExtension,this_03);
    if (bVar1) {
      WorldState::produceFactFlag(&local_38->state,LostLead,true);
    }
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::tickEmotionalState(float dt)
{
	auto& alertness = state.current.values[WorldStateIdentifier::Alertness];
	alertness = clamp(alertness - 0.09f, 0.f, 100.f);

	auto& boredom = state.current.values[WorldStateIdentifier::Boredom];
	boredom = clamp(boredom + 0.01f, 0.f, 100.f);

	auto& alertnessTracker = state.valueTrackers[WorldStateIdentifier::Alertness];
	auto& curiosityTracker = state.valueTrackers[WorldStateIdentifier::Curiosity];
	
	alertnessTracker.update(alertness, dt);
	curiosityTracker.update(state.current.values[WorldStateIdentifier::Curiosity], dt);
	
	if (alertnessTracker.durationExceedsExtension(alertnessTracker)
		&& curiosityTracker.durationExceedsExtension(curiosityTracker))
	{
		state.produceFactFlag(ConsumableFact::LostLead, true);
	}
	
	return;
}